

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::teximage3d_invalid_border
               (NegativeTestContext *ctx)

{
  bool bVar1;
  ContextType ctxType;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_INVALID_VALUE is generated if border is not 0 or 1.","");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x806f,0,0x1907,1,1,1,-1,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x806f,0,0x1907,1,1,1,2,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x1907,1,1,1,-1,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x8c1a,0,0x1907,1,1,1,2,0x1907,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_OES_texture_cube_map_array");
    if (!bVar1) goto LAB_015c863f;
  }
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x9009,1,0x1908,1,1,6,-1,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexImage3D
            (&ctx->super_CallLogWrapper,0x9009,1,0x1908,1,1,6,1,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x501);
LAB_015c863f:
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void teximage3d_invalid_border (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if border is not 0 or 1.");
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGB, 1, 1, 1, -1, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_3D, 0, GL_RGB, 1, 1, 1, 2, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGB, 1, 1, 1, -1, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, GL_RGB, 1, 1, 1, 2, GL_RGB, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 1, GL_RGBA, 1, 1, 6, -1, GL_RGBA, GL_UNSIGNED_BYTE, 0);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 1, GL_RGBA, 1, 1, 6, 1, GL_RGBA, GL_UNSIGNED_BYTE, 0);
		ctx.expectError(GL_INVALID_VALUE);
	}

	ctx.endSection();
}